

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t httplib::detail::write_headers<httplib::Request>
                  (Stream *strm,Request *info,Headers *headers)

{
  int iVar1;
  ssize_t sVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  int extraout_var;
  long lVar5;
  long lVar6;
  _Rb_tree_header *p_Var7;
  char *local_40;
  char *local_38;
  
  lVar6 = 0;
  for (p_Var3 = (info->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(info->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    iVar1 = std::__cxx11::string::compare((char *)(p_Var3 + 1));
    if (iVar1 != 0) {
      local_38 = *(char **)(p_Var3 + 1);
      local_40 = *(char **)(p_Var3 + 2);
      sVar2 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_38,&local_40);
      if (sVar2 < 0) {
        return sVar2;
      }
      lVar6 = lVar6 + sVar2;
    }
  }
  p_Var4 = (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(headers->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    do {
      local_38 = *(char **)(p_Var4 + 1);
      local_40 = *(char **)(p_Var4 + 2);
      sVar2 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_38,&local_40);
      if (sVar2 < 0) {
        return sVar2;
      }
      lVar6 = lVar6 + sVar2;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  iVar1 = (*strm->_vptr_Stream[5])(strm,"\r\n",2);
  lVar5 = 0;
  if (-1 < extraout_var) {
    lVar5 = lVar6;
  }
  return lVar5 + CONCAT44(extraout_var,iVar1);
}

Assistant:

inline ssize_t write_headers(Stream &strm, const T &info,
									 const Headers &headers) {
			ssize_t write_len = 0;
			for (const auto &x : info.headers) {
				if (x.first == "EXCEPTION_WHAT") { continue; }
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			for (const auto &x : headers) {
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			auto len = strm.write("\r\n");
			if (len < 0) { return len; }
			write_len += len;
			return write_len;
		}